

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int32_t zng_gzflush(gzFile file,int flush)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int unaff_retaddr;
  gz_state *state;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int32_t iVar2;
  
  if (in_RDI == 0) {
    iVar2 = -2;
  }
  else if ((*(int *)(in_RDI + 0x18) == 0x79b1) && (*(int *)(in_RDI + 0x74) == 0)) {
    if ((in_ESI < 0) || (4 < in_ESI)) {
      iVar2 = -2;
    }
    else {
      if (*(int *)(in_RDI + 0x70) != 0) {
        *(undefined4 *)(in_RDI + 0x70) = 0;
        iVar1 = gz_zero((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI);
        if (iVar1 == -1) {
          return *(int32_t *)(in_RDI + 0x74);
        }
      }
      gz_comp(state,unaff_retaddr);
      iVar2 = *(int32_t *)(in_RDI + 0x74);
    }
  }
  else {
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int Z_EXPORT PREFIX(gzflush)(gzFile file, int flush) {
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_state *)file;

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* check flush parameter */
    if (flush < 0 || flush > Z_FINISH)
        return Z_STREAM_ERROR;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* compress remaining data with requested flush */
    (void)gz_comp(state, flush);
    return state->err;
}